

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioJson.c
# Opt level: O0

void Json_Write(char *pFileName,Abc_Nam_t *pStr,Vec_Wec_t *vObjs)

{
  FILE *__stream;
  Vec_Int_t *vArray;
  FILE *pFile;
  Vec_Wec_t *vObjs_local;
  Abc_Nam_t *pStr_local;
  char *pFileName_local;
  
  __stream = fopen(pFileName,"wb");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open file \"%s\" for writing.\n",pFileName);
  }
  else {
    vArray = Vec_WecEntry(vObjs,0);
    Json_Write_rec((FILE *)__stream,pStr,vObjs,vArray,1,0,1);
    fclose(__stream);
  }
  return;
}

Assistant:

void Json_Write( char * pFileName, Abc_Nam_t * pStr, Vec_Wec_t * vObjs )
{
    FILE * pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open file \"%s\" for writing.\n", pFileName );
        return;
    }
    Json_Write_rec( pFile, pStr, vObjs, Vec_WecEntry(vObjs, 0), 1, 0, 1 );
    fclose( pFile );
}